

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

int mmu_translate(CPUS390XState_conflict *env,target_ulong vaddr,int rw,uint64_t asc,
                 target_ulong *raddr,int *flags,uint64_t *tec)

{
  _Bool _Var1;
  int iVar2;
  target_ulong tVar3;
  bool bVar4;
  uint64_t uStack_48;
  int r;
  uint64_t asce;
  int *flags_local;
  target_ulong *raddr_local;
  uint64_t asc_local;
  int rw_local;
  target_ulong vaddr_local;
  CPUS390XState_conflict *env_local;
  
  iVar2 = 0x800;
  if (rw == 1) {
    iVar2 = 0x400;
  }
  *tec = vaddr & 0xfffffffffffff000 | asc >> 0x2e | (long)iVar2;
  *flags = 7;
  _Var1 = is_low_address(vaddr & 0xfffffffffffff000);
  if ((_Var1) && (_Var1 = lowprot_enabled(env,asc), _Var1)) {
    *flags = *flags | 0x40;
    _Var1 = is_low_address(vaddr);
    if ((_Var1) && (rw == 1)) {
      *tec = *tec | 0x80;
      return 4;
    }
  }
  if (((env->psw).mask & 0x400000000000000) == 0) {
    *raddr = vaddr & 0xfffffffffffff000;
  }
  else {
    if (asc == 0) {
      uStack_48 = env->cregs[1];
    }
    else if (asc != 0x400000000000) {
      if (asc == 0x800000000000) {
        uStack_48 = env->cregs[7];
      }
      else if (asc == 0xc00000000000) {
        uStack_48 = env->cregs[0xd];
      }
    }
    iVar2 = mmu_translate_asce(env,vaddr & 0xfffffffffffff000,asc,uStack_48,raddr,flags,rw);
    if (iVar2 != 0) {
      return iVar2;
    }
    bVar4 = false;
    if (rw == 1) {
      bVar4 = (*flags & 2U) == 0;
    }
    if (bVar4) {
      *tec = *tec | 4;
      return 4;
    }
    bVar4 = false;
    if (rw == 2) {
      bVar4 = (*flags & 4U) == 0;
    }
    if (bVar4) {
      *tec = *tec | 0x84;
      return 4;
    }
  }
  tVar3 = mmu_real2abs(env,*raddr);
  *raddr = tVar3;
  mmu_handle_skey((uc_struct *)env->uc,*raddr,rw,flags);
  return 0;
}

Assistant:

int mmu_translate(CPUS390XState *env, target_ulong vaddr, int rw, uint64_t asc,
                  target_ulong *raddr, int *flags, uint64_t *tec)
{
    uint64_t asce;
    int r;

    *tec = (vaddr & TARGET_PAGE_MASK) | (asc >> 46) |
            (rw == MMU_DATA_STORE ? FS_WRITE : FS_READ);
    *flags = PAGE_READ | PAGE_WRITE | PAGE_EXEC;

    if (is_low_address(vaddr & TARGET_PAGE_MASK) && lowprot_enabled(env, asc)) {
        /*
         * If any part of this page is currently protected, make sure the
         * TLB entry will not be reused.
         *
         * As the protected range is always the first 512 bytes of the
         * two first pages, we are able to catch all writes to these areas
         * just by looking at the start address (triggering the tlb miss).
         */
        *flags |= PAGE_WRITE_INV;
        if (is_low_address(vaddr) && rw == MMU_DATA_STORE) {
            /* LAP sets bit 56 */
            *tec |= 0x80;
            return PGM_PROTECTION;
        }
    }

    vaddr &= TARGET_PAGE_MASK;

    if (!(env->psw.mask & PSW_MASK_DAT)) {
        *raddr = vaddr;
        goto nodat;
    }

    switch (asc) {
    case PSW_ASC_PRIMARY:
        asce = env->cregs[1];
        break;
    case PSW_ASC_HOME:
        asce = env->cregs[13];
        break;
    case PSW_ASC_SECONDARY:
        asce = env->cregs[7];
        break;
    case PSW_ASC_ACCREG:
    default:
        // hw_error("guest switched to unknown asc mode\n");
        break;
    }

    /* perform the DAT translation */
    r = mmu_translate_asce(env, vaddr, asc, asce, raddr, flags, rw);
    if (unlikely(r)) {
        return r;
    }

    /* check for DAT protection */
    if (unlikely(rw == MMU_DATA_STORE && !(*flags & PAGE_WRITE))) {
        /* DAT sets bit 61 only */
        *tec |= 0x4;
        return PGM_PROTECTION;
    }

    /* check for Instruction-Execution-Protection */
    if (unlikely(rw == MMU_INST_FETCH && !(*flags & PAGE_EXEC))) {
        /* IEP sets bit 56 and 61 */
        *tec |= 0x84;
        return PGM_PROTECTION;
    }

nodat:
    /* Convert real address -> absolute address */
    *raddr = mmu_real2abs(env, *raddr);

    mmu_handle_skey(env->uc, *raddr, rw, flags);
    return 0;
}